

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBuffer.hpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLBuffer::append(XMLBuffer *this,XMLCh *chars)

{
  XMLSize_t local_20;
  XMLSize_t count;
  XMLCh *chars_local;
  XMLBuffer *this_local;
  
  if ((chars != (XMLCh *)0x0) && (*chars != L'\0')) {
    for (local_20 = 0; chars[local_20] != L'\0'; local_20 = local_20 + 1) {
    }
    if (this->fCapacity <= this->fIndex + local_20) {
      ensureCapacity(this,local_20);
    }
    memcpy(this->fBuffer + this->fIndex,chars,local_20 << 1);
    this->fIndex = local_20 + this->fIndex;
  }
  return;
}

Assistant:

void append (const XMLCh* const chars)
    {
        if (chars != 0 && *chars != 0) {
            // get length of chars
            XMLSize_t count = 0;
            for (; *(chars+count); count++ ) /*noop*/;

            if (fIndex + count >= fCapacity) {
                ensureCapacity(count);
            }
            memcpy(&fBuffer[fIndex], chars, count * sizeof(XMLCh));
            fIndex += count;
        }
    }